

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Export * __thiscall wasm::Module::getExport(Module *this,Name name)

{
  mapped_type pEVar1;
  mapped_type *ppEVar2;
  string *in_R8;
  Name name_00;
  long *local_50 [2];
  long local_40 [2];
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"getExport","");
  name_00.super_IString.str._M_str = (char *)local_50;
  ppEVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
                      ((wasm *)&this->exportsMap,name.super_IString.str._M_len,name_00,in_R8);
  pEVar1 = *ppEVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return pEVar1;
}

Assistant:

Export* Module::getExport(Name name) {
  return getModuleElement(exportsMap, name, "getExport");
}